

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::(anonymous_namespace)::XformEvaluator::result_abi_cxx11_
          (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,void *this)

{
  long lVar1;
  undefined8 *puVar2;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *peVar3;
  string local_30 [32];
  
  if (*(long *)((long)this + 8) == 0) {
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    puVar2 = (undefined8 *)((long)this + 0x20);
    peVar3 = __return_storage_ptr__;
    for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)
       &(peVar3->contained).
        super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0 = *puVar2;
      puVar2 = puVar2 + 1;
      peVar3 = (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&(peVar3->contained).
                          super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0 + 8);
    }
  }
  else {
    std::__cxx11::string::string(local_30,(string *)this);
    nonstd::expected_lite::
    expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,
               (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_30);
    std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<value::matrix4d, std::string> result() const {
    if (err.empty()) {
      return m;
    }

    return nonstd::make_unexpected(err);
  }